

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# support.c
# Opt level: O3

int highest_bit_set(lword x)

{
  int h;
  int iVar1;
  int i;
  
  i = 0;
  iVar1 = -1;
  do {
    if ((x & 1U) != 0) {
      iVar1 = i;
    }
    x = x >> 1;
    i = i + 1;
  } while (i != 0x40);
  return iVar1;
}

Assistant:

int highest_bit_set(lword x)
/* return number of highest bit set */
{
  int i,h=-1,n=sizeof(lword)<<3;

  for (i=0; i<n; i++) {
    if (x & 1)
      h = i;
    x >>= 1;
  }
  return h;
}